

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O1

void freelistcell(LispPTR cell)

{
  uint uVar1;
  uint uVar2;
  DLword *pDVar3;
  dtd *pdVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if ((cell & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar3 = Lisp_world;
  uVar8 = cell >> 8 & 0xfffff;
  uVar12 = uVar8 << 9;
  uVar11 = (ulong)cell & 0xff;
  uVar10 = (uint)uVar11;
  if (uVar10 < 8) {
    error("freeing CONS cell that\'s really freelist ptr");
  }
  uVar1 = *(uint *)((long)pDVar3 + (ulong)uVar12 + 8);
  if (uVar1 < 0x1000000) {
    *(uint *)((long)pDVar3 + (ulong)uVar12 + 8) = uVar1 & 0xffff | uVar10 << 0x10;
    *(undefined1 *)((long)pDVar3 + uVar11 * 2 + (ulong)uVar12 + 3) = 0;
  }
  else {
    uVar6 = uVar1 >> 0x10 & 0xff;
    uVar9 = 0;
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        uVar7 = uVar6;
        uVar6 = uVar7;
        if ((uVar7 ^ 6) < (uVar10 ^ 6)) break;
        uVar2 = *(uint *)((long)pDVar3 + (ulong)uVar7 * 2 + (ulong)uVar12);
        uVar6 = uVar2 >> 0x18;
        uVar9 = uVar7;
      } while (0xffffff < uVar2);
    }
    if (uVar9 == 0) {
      *(uint *)((long)pDVar3 + (ulong)uVar12 + 8) = uVar1 & 0xff00ffff | uVar10 << 0x10;
    }
    else {
      *(char *)((long)pDVar3 + (ulong)uVar9 * 2 + (ulong)uVar12 + 3) = (char)cell;
    }
    *(char *)((long)pDVar3 + (ulong)cell * 2 + 3) = (char)uVar6;
  }
  bVar5 = *(char *)((long)pDVar3 + (ulong)uVar12 + 0xb) + 1;
  *(byte *)((long)pDVar3 + (ulong)uVar12 + 0xb) = bVar5;
  pdVar4 = ListpDTD;
  if ((0x20 < bVar5) && (*(int *)((long)pDVar3 + (ulong)uVar12 + 0xc) == -1)) {
    *(LispPTR *)((long)pDVar3 + (ulong)uVar12 + 0xc) = ListpDTD->dtd_nextpage;
    pdVar4->dtd_nextpage = uVar8;
  }
  return;
}

Assistant:

void freelistcell(LispPTR cell) {
  struct conspage *pbase;
  ConsCell *cell68k;
  unsigned int offset, prior, celloffset;

  cell68k = (ConsCell *)NativeAligned4FromLAddr(cell);
  pbase = (struct conspage *)NativeAligned4FromLPage(POINTER_PAGE(cell));
  celloffset = (LispPTR)cell & 0xFF;
#ifdef NEWCDRCODING
  if (celloffset < 8) error("freeing CONS cell that's really freelist ptr");
#endif /* NEWCDRCODING */

  if (pbase->count) /* There are free cells on the page already */
  {
    prior = 0;

    for (offset = pbase->next_cell; offset; offset = FREECONS(pbase, offset)->next_free) {
#ifdef NEWCDRCODING
      if ((6 ^ offset) < (6 ^ celloffset))
#else
      if (offset < celloffset)
#endif /* NEWCDRCODING */
      {
        break;
      }
      prior = offset;
    }

    if (prior)
      FREECONS(pbase, prior)->next_free = celloffset;
    else
      pbase->next_cell = celloffset;
    ((freecons *)cell68k)->next_free = offset;
  } else /* NO FREE CELLS.  Just replace next_free. */
  {
    pbase->next_cell = celloffset;
    FREECONS(pbase, celloffset)->next_free = 0; /* And this is end of the chain */
  }

  if ((++pbase->count > 32) && (pbase->next_page == CONSPAGE_LAST)) {
    pbase->next_page = ListpDTD->dtd_nextpage;
    ListpDTD->dtd_nextpage = POINTER_PAGE(cell);
  }
}